

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractscrollarea.cpp
# Opt level: O2

void __thiscall
QAbstractScrollAreaScrollBarContainer::QAbstractScrollAreaScrollBarContainer
          (QAbstractScrollAreaScrollBarContainer *this,Orientation orientation,QWidget *parent)

{
  QScrollBar *this_00;
  QLayout *l;
  long in_FS_OFFSET;
  QMargins local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QWidget::QWidget(&this->super_QWidget,parent,(WindowFlags)0x0);
  *(undefined ***)&this->super_QWidget = &PTR_metaObject_007c4a98;
  *(undefined ***)&(this->super_QWidget).super_QPaintDevice =
       &PTR__QAbstractScrollAreaScrollBarContainer_007c4c48;
  this_00 = (QScrollBar *)operator_new(0x28);
  QScrollBar::QScrollBar(this_00,orientation,&this->super_QWidget);
  this->scrollBar = this_00;
  l = (QLayout *)operator_new(0x20);
  QBoxLayout::QBoxLayout((QBoxLayout *)l,(uint)(orientation != Horizontal) * 2,(QWidget *)0x0);
  this->layout = (QBoxLayout *)l;
  this->orientation = orientation;
  QWidget::setLayout(&this->super_QWidget,l);
  local_38.m_left.m_i = 0;
  local_38.m_top.m_i = 0;
  local_38.m_right.m_i = 0;
  local_38.m_bottom.m_i = 0;
  QLayout::setContentsMargins(&this->layout->super_QLayout,&local_38);
  (**(code **)(*(long *)&this->layout->super_QLayout + 0x68))(this->layout,0);
  QBoxLayout::addWidget(this->layout,(QWidget *)this->scrollBar,0,(Alignment)0x0);
  QLayout::setSizeConstraint(&this->layout->super_QLayout,SetMaximumSize);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QAbstractScrollAreaScrollBarContainer::QAbstractScrollAreaScrollBarContainer(Qt::Orientation orientation, QWidget *parent)
    :QWidget(parent), scrollBar(new QScrollBar(orientation, this)),
     layout(new QBoxLayout(orientation == Qt::Horizontal ? QBoxLayout::LeftToRight : QBoxLayout::TopToBottom)),
     orientation(orientation)
{
    setLayout(layout);
    layout->setContentsMargins(QMargins());
    layout->setSpacing(0);
    layout->addWidget(scrollBar);
    layout->setSizeConstraint(QLayout::SetMaximumSize);
}